

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpuid_tool.c
# Opt level: O1

int check_need_raw_data(void)

{
  long lVar1;
  long lVar2;
  
  if (((need_output == 0) && (need_report == 0)) && (need_identify == 0)) {
    if ((long)num_requests < 1) {
      return 0;
    }
    lVar1 = 0;
    do {
      lVar2 = 0x10;
      do {
        if ((requests[lVar1] ==
             *(output_data_switch *)((long)&__frame_dummy_init_array_entry + lVar2)) &&
           (*(int *)((long)&matchtable[0].sw + lVar2) != 0)) {
          return 1;
        }
        lVar2 = lVar2 + 0x18;
      } while (lVar2 != 0x4c0);
      lVar1 = lVar1 + 1;
      if (lVar1 == num_requests) {
        return 0;
      }
    } while( true );
  }
  return 1;
}

Assistant:

static int check_need_raw_data(void)
{
	int i, j;

	if (need_output || need_report || need_identify) return 1;
	for (i = 0; i < num_requests; i++) {
		for (j = 0; j < sz_match; j++)
			if (requests[i] == matchtable[j].sw &&
			    matchtable[j].ident_required) return 1;
	}
	return 0;
}